

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_wait_eof(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *session_00;
  int iVar1;
  int rc;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel_local;
  
  session_00 = channel->session;
  if (channel->wait_eof_state == libssh2_NB_state_idle) {
    channel->wait_eof_state = libssh2_NB_state_created;
  }
  do {
    if ((channel->remote).eof != '\0') {
      channel->wait_eof_state = libssh2_NB_state_idle;
      return 0;
    }
    if (((ulong)(channel->remote).window_size == channel->read_avail) &&
       (session_00->api_block_mode != 0)) {
      iVar1 = _libssh2_error(session_00,-0x2f,"Receiving channel window has been exhausted");
      return iVar1;
    }
    iVar1 = _libssh2_transport_read(session_00);
    if (iVar1 == -0x25) {
      return -0x25;
    }
  } while (-1 < iVar1);
  channel->wait_eof_state = libssh2_NB_state_idle;
  iVar1 = _libssh2_error(session_00,iVar1,"_libssh2_transport_read() bailed out");
  return iVar1;
}

Assistant:

static int channel_wait_eof(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    int rc;

    if(channel->wait_eof_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Awaiting EOF for channel %u/%u", channel->local.id,
                       channel->remote.id));

        channel->wait_eof_state = libssh2_NB_state_created;
    }

    /*
     * While channel is not eof, read more packets from the network.
     * Either the EOF will be set or network timeout will occur.
     */
    do {
        if(channel->remote.eof) {
            break;
        }

        if((channel->remote.window_size == channel->read_avail) &&
            session->api_block_mode)
            return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_WINDOW_FULL,
                                  "Receiving channel window "
                                  "has been exhausted");

        rc = _libssh2_transport_read(session);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc < 0) {
            channel->wait_eof_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "_libssh2_transport_read() bailed out");
        }
    } while(1);

    channel->wait_eof_state = libssh2_NB_state_idle;

    return 0;
}